

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O2

void __thiscall
adios2::transportman::TransportMan::FlushFiles(TransportMan *this,int transportIndex)

{
  bool bVar1;
  iterator itTransport;
  __node_base *p_Var2;
  TransportMan *this_00;
  string local_58;
  
  if (transportIndex == -1) {
    p_Var2 = &(this->m_Transports)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(_Hash_node_base **)
                                &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor + 1),
                              "File");
      if (bVar1) {
        (*(code *)(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)
                  ->_M_nxt[10]._M_nxt)();
      }
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)(long)transportIndex;
    itTransport = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->m_Transports)._M_h,(key_type *)&local_58);
    std::__cxx11::to_string(&local_58,transportIndex);
    this_00 = (TransportMan *)&stack0xffffffffffffffc8;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   ", in call to FlushFiles with index ",&local_58);
    CheckFile(this_00,(const_iterator)
                      itTransport.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                      ._M_cur,(string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::__cxx11::string::~string((string *)&local_58);
    (**(code **)(**(long **)((long)itTransport.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                                   ._M_cur + 0x10) + 0x50))();
  }
  return;
}

Assistant:

void TransportMan::FlushFiles(const int transportIndex)
{
    if (transportIndex == -1)
    {
        for (auto &transportPair : m_Transports)
        {
            auto &transport = transportPair.second;

            if (transport->m_Type == "File")
            {
                transport->Flush();
            }
        }
    }
    else
    {
        auto itTransport = m_Transports.find(transportIndex);
        CheckFile(itTransport,
                  ", in call to FlushFiles with index " + std::to_string(transportIndex));
        itTransport->second->Flush();
    }
}